

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::Impl::remap_render_pass_handle
          (Impl *this,VkRenderPass render_pass,VkRenderPass *out_render_pass)

{
  ulong uVar1;
  bool bVar2;
  _Hash_node_base *p_Var3;
  ulong uVar4;
  bool bVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  long *in_FS_OFFSET;
  
  if (render_pass == (VkRenderPass)0x0) {
    *out_render_pass = (VkRenderPass)0x0;
    bVar5 = true;
  }
  else {
    uVar1 = (this->render_pass_to_hash)._M_h._M_bucket_count;
    uVar4 = (ulong)render_pass % uVar1;
    p_Var6 = (this->render_pass_to_hash)._M_h._M_buckets[uVar4];
    p_Var7 = (__node_base_ptr)0x0;
    if ((p_Var6 != (__node_base_ptr)0x0) &&
       (p_Var3 = p_Var6->_M_nxt, p_Var7 = p_Var6,
       (VkRenderPass)p_Var6->_M_nxt[1]._M_nxt != render_pass)) {
      while (p_Var6 = p_Var3, p_Var3 = p_Var6->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
        p_Var7 = (__node_base_ptr)0x0;
        if (((ulong)p_Var3[1]._M_nxt % uVar1 != uVar4) ||
           (p_Var7 = p_Var6, (VkRenderPass)p_Var3[1]._M_nxt == render_pass)) goto LAB_0016c3e4;
      }
      p_Var7 = (__node_base_ptr)0x0;
    }
LAB_0016c3e4:
    if (p_Var7 == (__node_base_ptr)0x0) {
      p_Var3 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var3 = p_Var7->_M_nxt;
    }
    bVar5 = p_Var3 != (_Hash_node_base *)0x0;
    if (p_Var3 == (_Hash_node_base *)0x0) {
      if ((*(int *)(*in_FS_OFFSET + -0x20) < 2) &&
         (bVar2 = Internal::log_thread_callback
                            (LOG_DEFAULT,
                             "Cannot find render pass in hashmap.\nObject has either not been recorded, or it was not supported by Fossilize.\n"
                            ), !bVar2)) {
        remap_render_pass_handle();
      }
    }
    else {
      *out_render_pass = (VkRenderPass)p_Var3[2]._M_nxt;
    }
  }
  return bVar5;
}

Assistant:

bool StateRecorder::Impl::remap_render_pass_handle(VkRenderPass render_pass, VkRenderPass *out_render_pass) const
{
	if (render_pass == VK_NULL_HANDLE)
	{
		// Dynamic rendering.
		*out_render_pass = VK_NULL_HANDLE;
		return true;
	}

	auto itr = render_pass_to_hash.find(render_pass);
	if (itr == end(render_pass_to_hash))
	{
		LOGW_LEVEL("Cannot find render pass in hashmap.\n"
		           "Object has either not been recorded, or it was not supported by Fossilize.\n");
		return false;
	}
	else
	{
		*out_render_pass = api_object_cast<VkRenderPass>(uint64_t(itr->second));
		return true;
	}
}